

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O1

void __thiscall DIS::MinefieldDataPdu::MinefieldDataPdu(MinefieldDataPdu *this)

{
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldDataPdu_001a0788;
  EntityID::EntityID(&this->_minefieldID);
  EntityID::EntityID(&this->_requestingEntityID);
  this->_dataFilter = 0;
  this->_minefieldSequenceNumbeer = 0;
  this->_requestID = '\0';
  this->_pduSequenceNumber = '\0';
  this->_numberOfPdus = '\0';
  this->_numberOfMinesInThisPdu = '\0';
  this->_numberOfSensorTypes = '\0';
  this->_pad2 = '\0';
  EntityType::EntityType(&this->_mineType);
  (this->_mineLocation).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mineLocation).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mineLocation).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_sensorTypes).super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sensorTypes).super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  Pdu::setPduType((Pdu *)this,'\'');
  return;
}

Assistant:

MinefieldDataPdu::MinefieldDataPdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _requestingEntityID(), 
   _minefieldSequenceNumbeer(0), 
   _requestID(0), 
   _pduSequenceNumber(0), 
   _numberOfPdus(0), 
   _numberOfMinesInThisPdu(0), 
   _numberOfSensorTypes(0), 
   _pad2(0), 
   _dataFilter(0), 
   _mineType(), 
   _pad3(0)
{
    setPduType( 39 );
}